

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O2

void __thiscall cnn::Device_CPU::~Device_CPU(Device_CPU *this)

{
  ~Device_CPU(this);
  operator_delete(this);
  return;
}

Assistant:

Device_CPU::~Device_CPU() {}